

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaDAG.cpp
# Opt level: O0

void __thiscall MatryoshkaDAG::computeTopK(MatryoshkaDAG *this)

{
  size_t sVar1;
  SubProblem *pSVar2;
  reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  SubProblem *in_RDI;
  value_type nonDomainCandidate_1;
  size_t j;
  size_t i;
  anon_class_16_2_fd512dd9 pushSubProblem;
  value_type domainCandidate;
  value_type nonDomainCandidate;
  size_t k;
  heapT heapOPTDomain;
  heapT heapOPTNonDomain;
  size_t l;
  binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
  *in_stack_fffffffffffffeb0;
  heapT *in_stack_fffffffffffffeb8;
  binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
  *in_stack_fffffffffffffec0;
  handle_type in_stack_fffffffffffffed8;
  value_type *in_stack_fffffffffffffee0;
  handle_type in_stack_fffffffffffffee8;
  heapT *in_stack_fffffffffffffef8;
  node_pointer in_stack_ffffffffffffff00;
  size_type local_f0;
  ulong local_e8;
  ulong local_88;
  ulong local_10;
  
  for (local_10 = 2; local_10 <= *(ulong *)((long)in_RDI->score + 0x30); local_10 = local_10 + 1) {
    boost::heap::
    binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
    ::binomial_heap(in_stack_fffffffffffffec0,(value_compare *)in_stack_fffffffffffffeb8);
    boost::heap::
    binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
    ::binomial_heap(in_stack_fffffffffffffec0,(value_compare *)in_stack_fffffffffffffeb8);
    for (local_88 = 1; local_88 < local_10; local_88 = local_88 + 1) {
      pvVar3 = std::
               vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
               ::operator[]((vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                             *)&in_RDI[2].backOptimalIndex,local_88 - 1);
      std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>::operator[]
                (pvVar3,0);
      in_stack_fffffffffffffee8 =
           boost::heap::
           binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
           ::push(in_stack_fffffffffffffee8.node_,in_stack_fffffffffffffee0);
      pvVar3 = std::
               vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
               ::operator[]((vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                             *)&in_RDI[1].backOptimalIndex,local_88 - 1);
      std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>::operator[]
                (pvVar3,0);
      in_stack_fffffffffffffee0 =
           (value_type *)
           q((MatryoshkaDAG *)in_stack_fffffffffffffee8.node_,(size_t)in_stack_fffffffffffffee0,
             (size_t)in_stack_fffffffffffffed8.node_);
      in_stack_fffffffffffffed8 =
           boost::heap::
           binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
           ::push(in_stack_fffffffffffffee8.node_,in_stack_fffffffffffffee0);
    }
    local_f0 = 0;
    for (local_e8 = 0; local_e8 < *(ulong *)((long)in_RDI->score + 0x38); local_e8 = local_e8 + 1) {
      pvVar4 = boost::heap::
               binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
               ::top(in_stack_fffffffffffffeb0);
      pSVar2 = in_RDI + 2;
      pvVar3 = std::
               vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
               ::operator[]((vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                             *)&pSVar2->backOptimalIndex,local_10);
      pvVar5 = std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>::
               operator[](pvVar3,local_e8);
      pvVar5->backOptimalIndex = pvVar4->backOptimalIndex;
      sVar1 = pvVar4->backPointer;
      pvVar5->score = pvVar4->score;
      pvVar5->backPointer = sVar1;
      pvVar3 = std::
               vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
               ::operator[]((vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                             *)&pSVar2->backOptimalIndex,local_10);
      std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>::operator[]
                (pvVar3,local_e8);
      computeTopK::anon_class_16_2_fd512dd9::operator()
                ((anon_class_16_2_fd512dd9 *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 in_RDI,SUB81((ulong)in_stack_fffffffffffffee8.node_ >> 0x38,0));
      in_stack_fffffffffffffec0 =
           (binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
            *)boost::heap::
              binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
              ::top(in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffeb8 =
           (heapT *)(in_stack_fffffffffffffec0->super_type).super_base_type.
                    super_size_holder<true,_unsigned_long>.size_;
      in_stack_ffffffffffffff00 = in_stack_fffffffffffffec0->top_element;
      sVar1 = (in_stack_fffffffffffffec0->trees).super_type.data_.root_plus_size_.super_size_traits.
              size_;
      in_stack_fffffffffffffef8 = in_stack_fffffffffffffeb8;
      pvVar3 = std::
               vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
               ::operator[]((vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                             *)&in_RDI[2].backOptimalIndex,local_10);
      pvVar5 = std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>::
               operator[](pvVar3,local_f0);
      if ((double)in_stack_fffffffffffffeb8 < pvVar5->score ||
          (double)in_stack_fffffffffffffeb8 == pvVar5->score) {
        pvVar3 = std::
                 vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                 ::operator[]((vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                               *)&in_RDI[2].backOptimalIndex,local_10);
        in_stack_fffffffffffffeb0 =
             (binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
              *)std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>::
                operator[](pvVar3,local_f0);
        pvVar3 = std::
                 vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                 ::operator[]((vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                               *)&in_RDI[1].backOptimalIndex,local_10);
        pvVar5 = std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                 ::operator[](pvVar3,local_e8);
        pvVar5->score =
             (double)(in_stack_fffffffffffffeb0->super_type).super_base_type.
                     super_size_holder<true,_unsigned_long>.size_;
        pvVar5->backPointer = (size_t)in_stack_fffffffffffffeb0->top_element;
        pvVar5->backOptimalIndex =
             (in_stack_fffffffffffffeb0->trees).super_type.data_.root_plus_size_.super_size_traits.
             size_;
        local_f0 = local_f0 + 1;
      }
      else {
        pvVar3 = std::
                 vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                 ::operator[]((vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                               *)&in_RDI[1].backOptimalIndex,local_10);
        pvVar5 = std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                 ::operator[](pvVar3,local_e8);
        pvVar5->backOptimalIndex = sVar1;
        pvVar5->score = (double)in_stack_fffffffffffffef8;
        pvVar5->backPointer = (size_t)in_stack_ffffffffffffff00;
        computeTopK::anon_class_16_2_fd512dd9::operator()
                  ((anon_class_16_2_fd512dd9 *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                   in_RDI,SUB81((ulong)in_stack_fffffffffffffee8.node_ >> 0x38,0));
      }
    }
    boost::heap::
    binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
    ::~binomial_heap(in_stack_fffffffffffffeb0);
    boost::heap::
    binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
    ::~binomial_heap(in_stack_fffffffffffffeb0);
  }
  return;
}

Assistant:

void MatryoshkaDAG::computeTopK() {
    //std::cerr << "begin computeTopK()\n";
    for (size_t l=2; l<=params->n; l++) {
        /*
        
        OPT(l) = max{  max_{ k<l } OPTD(k-1),  // OPT(l) ends in a non-domain
                       OPTD(l) }               // OPT(l) ends in a domain
        
        OPTD(l) = max_{ k<l } OPT(k-1) + q(k,l)
        
        */
        using heapT = boost::heap::binomial_heap<SubProblem>;
        heapT heapOPTNonDomain;
        heapT heapOPTDomain;

        for (size_t k=1; k<l; k++) {
            auto nonDomainCandidate = OPTD[k-1][0];
            nonDomainCandidate.backPointer = k;
            heapOPTNonDomain.push(nonDomainCandidate); 

            auto domainCandidate = OPT[k-1][0];
            domainCandidate.score += q(k,l);
            domainCandidate.backPointer = k;
            heapOPTDomain.push(domainCandidate);
        }

        auto pushSubProblem = [&](heapT & heap, SubProblem & subProb, bool isDomain) {
            heap.pop();
            auto nextOptimalIndex = subProb.backOptimalIndex + 1;
            auto k = subProb.backPointer;

            if (nextOptimalIndex < params->K) {
                SubProblem newCandidate;
                if (isDomain) {
                    newCandidate = OPT[k-1][nextOptimalIndex];
                    newCandidate.score += q(k,l);
                } else {
                    newCandidate = OPTD[k-1][nextOptimalIndex];
                }
                newCandidate.backPointer = k;
                newCandidate.backOptimalIndex = nextOptimalIndex;
                heap.push(newCandidate);
            }
        };

        size_t i = 0;
        size_t j = 0;
        while (i < params->K) {
            OPTD[l][i] = heapOPTDomain.top();
            pushSubProblem(heapOPTDomain, OPTD[l][i], true);
            auto nonDomainCandidate = heapOPTNonDomain.top();
             
            if (nonDomainCandidate.score > OPTD[l][j].score) {
                OPT[l][i] = nonDomainCandidate;
                pushSubProblem(heapOPTNonDomain, nonDomainCandidate, false);
            } else {
                OPT[l][i] = OPTD[l][j];
                j++;
            }

            i++;    
        }
    }

    /*std::cerr << "In topK()\n";
    for (size_t i = 0; i < params->K; ++i) {
        std::cerr << "The " << i << "th-best solution had score " << OPT[params->n][i].score << "\n";
    }*/
}